

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

TValue * lj_tab_set(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  TValue *pTVar2;
  uint uVar3;
  
  t->nomm = '\0';
  uVar3 = (key->field_2).it;
  if (uVar3 == 0xfffffffb) {
    pTVar2 = lj_tab_setstr(L,t,(GCstr *)(ulong)(key->u32).lo);
    return pTVar2;
  }
  if (uVar3 < 0xfffeffff) {
    dVar1 = key->n;
    if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
      uVar3 = (uint)dVar1;
      if (uVar3 < t->asize) {
        return (TValue *)((ulong)(t->array).ptr32 + (long)(int)uVar3 * 8);
      }
      pTVar2 = lj_tab_setinth(L,t,uVar3);
      return pTVar2;
    }
    if (NAN(dVar1)) {
      lj_err_msg(L,LJ_ERR_NANIDX);
    }
    uVar3 = (uint)((ulong)dVar1 >> 0x20);
  }
  else if (uVar3 == 0xffffffff) {
    lj_err_msg(L,LJ_ERR_NILIDX);
  }
  pTVar2 = &hashkey(t,key)->val;
  do {
    if (*(uint *)((long)pTVar2 + 0xc) == uVar3) {
      if (0xfffffffc < uVar3) {
        return pTVar2;
      }
      if (uVar3 < 0xfffeffff) {
LAB_0010bbd8:
        if ((pTVar2[1].n == key->n) && (!NAN(pTVar2[1].n) && !NAN(key->n))) {
          return pTVar2;
        }
      }
      else if (pTVar2[1].u32.lo == (key->u32).lo) {
        return pTVar2;
      }
    }
    else if ((*(uint *)((long)pTVar2 + 0xc) < 0xffff0000) && (uVar3 < 0xffff0000))
    goto LAB_0010bbd8;
    pTVar2 = (TValue *)(ulong)pTVar2[2].u32.lo;
    if (pTVar2 == (TValue *)0x0) {
      pTVar2 = lj_tab_newkey(L,t,key);
      return pTVar2;
    }
  } while( true );
}

Assistant:

TValue *lj_tab_set(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n;
  t->nomm = 0;  /* Invalidate negative metamethod cache. */
  if (tvisstr(key)) {
    return lj_tab_setstr(L, t, strV(key));
  } else if (tvisint(key)) {
    return lj_tab_setint(L, t, intV(key));
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k)
      return lj_tab_setint(L, t, k);
    if (tvisnan(key))
      lj_err_msg(L, LJ_ERR_NANIDX);
    /* Else use the generic lookup. */
  } else if (tvisnil(key)) {
    lj_err_msg(L, LJ_ERR_NILIDX);
  }
  n = hashkey(t, key);
  do {
    if (lj_obj_equal(&n->key, key))
      return &n->val;
  } while ((n = nextnode(n)));
  return lj_tab_newkey(L, t, key);
}